

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

Emb_Man_t * Emb_ManStart(Gia_Man_t *pGia)

{
  Emb_Obj_t *pEVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  Emb_Man_t *pEVar7;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Int_t *p_00;
  uint *puVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  Gia_Obj_t *pGVar19;
  ulong uVar20;
  int iVar21;
  int nFanios;
  int nObjs;
  int local_8c;
  int local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  Emb_ManCreateRefsSpecial(pGia);
  Emb_ManTransformRefs(pGia,(int *)&local_44,&local_48);
  Gia_ManFillValue(pGia);
  pEVar7 = (Emb_Man_t *)calloc(1,0x68);
  pEVar7->pGia = pGia;
  iVar5 = pGia->nRegs;
  pEVar7->nRegs = iVar5;
  pVVar11 = pGia->vCis;
  iVar6 = pVVar11->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar21 = iVar6;
  if (iVar6 - 1U < 0xf) {
    iVar21 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar21;
  if (iVar21 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar21 << 2);
  }
  p->pArray = piVar8;
  pEVar7->vCis = p;
  pVVar12 = pGia->vCos;
  iVar21 = pVVar12->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar21 - 1U) {
    iVar15 = iVar21;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar15;
  if (iVar15 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar15 << 2);
  }
  p_00->pArray = piVar8;
  pEVar7->vCos = p_00;
  local_38 = (ulong)local_44;
  uVar16 = pVVar12->nSize;
  uVar3 = local_44 * 5 + (iVar5 + local_48 + uVar16) * 2;
  pEVar7->nObjData = uVar3;
  puVar9 = (uint *)calloc((long)(int)uVar3,4);
  pEVar7->pObjData = (int *)puVar9;
  pGVar19 = pGia->pObjs;
  pGVar19->Value = 0;
  *puVar9 = *puVar9 & 0xf | uVar16 << 4;
  uVar20 = (ulong)(uint)pGia->nObjs;
  if (pGia->nObjs < 1) {
LAB_0072b11b:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar14 = *pGia->pRefs;
  puVar9[1] = uVar14;
  uVar16 = (uVar16 & 0xfffffff) + uVar14 + 5;
  pEVar7->nObjs = 1;
  local_8c = 1;
  if (iVar6 < 1) {
    iVar5 = 1;
  }
  else {
    lVar10 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar10];
      if (((long)iVar5 < 0) || ((int)uVar20 <= iVar5)) goto LAB_0072b0fc;
      if (pGVar19 == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGVar19 + iVar5;
      pGVar4->Value = uVar16;
      Vec_IntPush(p,uVar16);
      puVar9[(ulong)uVar16 + 2] = uVar16;
      uVar14 = 0;
      if ((~(uint)*(undefined8 *)pGVar4 & 0x9fffffff) == 0) {
        uVar14 = (uint)(pGia->vCis->nSize - pGia->nRegs <=
                       (int)((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff)) << 4;
      }
      uVar17 = puVar9[uVar16] & 0xf | uVar14;
      puVar9[uVar16] = uVar17;
      pGVar19 = pGia->pObjs;
      if ((pGVar4 < pGVar19) || (uVar20 = (ulong)pGia->nObjs, pGVar19 + uVar20 <= pGVar4))
      goto LAB_0072b11b;
      uVar18 = pGia->pRefs[(int)((ulong)((long)pGVar4 - (long)pGVar19) >> 2) * -0x55555555];
      puVar9[(ulong)uVar16 + 1] = uVar18;
      puVar9[uVar16] = uVar17 | 1;
      uVar16 = uVar16 + (uVar14 >> 4) + uVar18 + 5;
      pEVar7->nObjs = (int)lVar10 + 2;
      lVar10 = lVar10 + 1;
      pVVar11 = pGia->vCis;
    } while (lVar10 < pVVar11->nSize);
    iVar5 = (int)lVar10 + 1;
  }
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar11->pArray = piVar8;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(400);
  pVVar12->pArray = piVar13;
  if (0 < (int)uVar20) {
    local_8c = 1;
    lVar10 = 0;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar19 = pGia->pObjs + lVar10;
      uVar14 = (uint)*(undefined8 *)pGVar19;
      if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
        if ((uVar14 >> 0x1e & 1) == 0) {
          if (pGia->pRefs[lVar10] != 0) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                          ,0x222,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
          }
        }
        else {
          if (pGia->pRefs[lVar10] < 1) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                          ,0x225,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
          }
          Emb_ManCollectSuper(pGia,pGVar19,pVVar11,pVVar12);
          pGVar19->Value = uVar16;
          puVar9[(ulong)uVar16 + 2] = uVar16;
          uVar14 = pVVar11->nSize;
          local_40 = (ulong)uVar14;
          uVar17 = puVar9[uVar16] & 0xf | uVar14 << 4;
          puVar9[uVar16] = uVar17;
          pGVar4 = pGia->pObjs;
          if ((pGVar19 < pGVar4) || (uVar20 = (ulong)pGia->nObjs, pGVar4 + uVar20 <= pGVar19))
          goto LAB_0072b11b;
          pEVar1 = (Emb_Obj_t *)(puVar9 + uVar16);
          uVar18 = pGia->pRefs[(int)((ulong)((long)pGVar19 - (long)pGVar4) >> 2) * -0x55555555];
          pEVar1->nFanouts = uVar18;
          if (0 < (int)uVar14) {
            piVar8 = pVVar11->pArray;
            uVar20 = 0;
            do {
              iVar6 = piVar8[uVar20];
              if (((long)iVar6 < 0) || (uVar14 = pGia->nObjs, (int)uVar14 <= iVar6))
              goto LAB_0072b0fc;
              if (pGia->pObjs == (Gia_Obj_t *)0x0) goto LAB_0072ad9c;
              Emb_ObjAddFanin(pEVar1,(Emb_Obj_t *)(puVar9 + pGia->pObjs[iVar6].Value));
              uVar20 = uVar20 + 1;
            } while (local_40 != uVar20);
            uVar14 = pGia->nObjs;
LAB_0072ad9c:
            uVar20 = (ulong)uVar14;
            uVar17 = *(uint *)pEVar1;
            uVar18 = pEVar1->nFanouts;
          }
          uVar16 = uVar16 + (uVar17 >> 4) + uVar18 + 5;
          local_8c = local_8c + 1;
          iVar5 = iVar5 + 1;
          pEVar7->nObjs = iVar5;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar20);
    piVar8 = pVVar11->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(pVVar11);
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  pVVar11 = pGia->vCos;
  if (0 < pVVar11->nSize) {
    lVar10 = 0;
    do {
      iVar6 = pVVar11->pArray[lVar10];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) goto LAB_0072b0fc;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar19 = pGia->pObjs + iVar6;
      pGVar19->Value = uVar16;
      Vec_IntPush(p_00,uVar16);
      puVar9[(ulong)uVar16 + 2] = uVar16;
      uVar14 = puVar9[uVar16];
      puVar9[uVar16] = (uVar14 & 0xf) + 0x10;
      uVar17 = (uint)*(undefined8 *)pGVar19;
      uVar18 = 1;
      if ((~uVar17 & 0x1fffffff) != 0 && (int)uVar17 < 0) {
        uVar18 = (pGia->vCos->nSize - pGia->nRegs <=
                 (int)((uint)((ulong)*(undefined8 *)pGVar19 >> 0x20) & 0x1fffffff)) + 1;
      }
      pEVar1 = (Emb_Obj_t *)(puVar9 + uVar16);
      pEVar1->nFanouts = uVar18;
      *(uint *)pEVar1 = uVar14 & 0xf | 0x12;
      Emb_ObjAddFanin(pEVar1,(Emb_Obj_t *)
                             (puVar9 + pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].
                                       Value));
      uVar16 = uVar16 + (*(uint *)pEVar1 >> 4) + pEVar1->nFanouts + 5;
      iVar5 = iVar5 + 1;
      pEVar7->nObjs = iVar5;
      lVar10 = lVar10 + 1;
      pVVar11 = pGia->vCos;
    } while (lVar10 < pVVar11->nSize);
  }
  iVar6 = pGia->nRegs;
  if (0 < iVar6) {
    iVar21 = 0;
LAB_0072af47:
    iVar15 = pGia->vCos->nSize;
    uVar14 = (iVar15 - iVar6) + iVar21;
    if (((int)uVar14 < 0) || (iVar15 <= (int)uVar14)) {
LAB_0072b13a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar15 = pGia->vCos->pArray[uVar14];
    if (((long)iVar15 < 0) || (pGia->nObjs <= iVar15)) {
LAB_0072b0fc:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar19 = pGia->pObjs;
    if (pGVar19 != (Gia_Obj_t *)0x0) {
      iVar2 = pGia->vCis->nSize;
      uVar14 = (iVar2 - iVar6) + iVar21;
      if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_0072b13a;
      uVar14 = pGia->vCis->pArray[uVar14];
      if (((long)(int)uVar14 < 0) || ((uint)pGia->nObjs <= uVar14)) goto LAB_0072b0fc;
      Emb_ObjAddFanin((Emb_Obj_t *)(puVar9 + pGVar19[(int)uVar14].Value),
                      (Emb_Obj_t *)(puVar9 + pGVar19[iVar15].Value));
      iVar21 = iVar21 + 1;
      iVar6 = pGia->nRegs;
      if (iVar21 < iVar6) goto LAB_0072af47;
    }
  }
  Gia_ManCleanMark0(pGia);
  if (local_8c != iVar5 - (p->nSize + p_00->nSize)) {
    __assert_fail("nNodes == Emb_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                  ,0x250,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if ((int)local_38 != iVar5) {
    __assert_fail("nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                  ,0x251,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (uVar16 != uVar3) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                  ,0x252,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  uVar3 = pGia->nObjs;
  if ((0 < (int)uVar3) && (pGVar19 = pGia->pObjs, pGVar19 != (Gia_Obj_t *)0x0)) {
    lVar10 = 0;
    do {
      uVar20 = (ulong)*(uint *)((long)&pGVar19->Value + lVar10);
      if (uVar20 != 0xffffffff) {
        if ((puVar9[uVar20] >> 4 != puVar9[uVar20 + 3]) &&
           ((~*(ulong *)(&pGVar19->field_0x0 + lVar10) & 0x1fffffff1fffffff) != 0)) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin || Gia_ObjIsConst0(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                        ,0x25b,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
        if ((puVar9[uVar20 + 1] != puVar9[uVar20 + 4]) &&
           ((uVar16 = (uint)*(undefined8 *)(&pGVar19->field_0x0 + lVar10), -1 < (int)uVar16 ||
            ((uVar16 & 0x1fffffff) == 0x1fffffff)))) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                        ,0x25c,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
        (puVar9 + uVar20 + 3)[0] = 0;
        (puVar9 + uVar20 + 3)[1] = 0;
      }
      lVar10 = lVar10 + 0xc;
    } while ((ulong)uVar3 * 0xc != lVar10);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pEVar7;
}

Assistant:

Emb_Man_t * Emb_ManStart( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    Emb_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo, * pFanin;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Emb_ManCreateRefsSpecial( pGia );
    Emb_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Emb_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Emb_Obj_t) / 4) * nObjs + 2 * (nFanios + Gia_ManRegNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Emb_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = Gia_ManCoNum(pGia);  //0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Emb_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Gia_ObjIsRo( pGia, pObj );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Emb_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Emb_ManObj( p, Gia_ObjValue(pFanin) ); 
            Emb_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 1 + Gia_ObjIsRi( pGia, pObj );
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Emb_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Emb_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
        Emb_ObjAddFanin( Emb_ManObj(p,Gia_ObjValue(pObjRo)), Emb_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Emb_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Emb_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Emb_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin || Gia_ObjIsConst0(pObj) );
        assert( pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj) );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}